

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadSplat<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Value value;
  unsigned_long local_10;
  
  RVar1 = Load<unsigned_long>(this,instr,&local_10,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    value.field_0._8_8_ = local_10;
    value.field_0.i64_ = local_10;
    Push(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}